

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int fmt::v8::detail::parse_nonnegative_int<char8_t>(char8_t **begin,char8_t *end,int error_value)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  
  pbVar1 = (byte *)*begin;
  if ((pbVar1 == (byte *)end) || (bVar7 = *pbVar1, 9 < (byte)(bVar7 - 0x30))) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8ca,"");
  }
  uVar2 = 0;
  pbVar6 = pbVar1;
  do {
    pbVar6 = pbVar6 + 1;
    uVar5 = (ulong)uVar2;
    uVar4 = (uint)bVar7;
    uVar2 = (uVar2 * 10 + uVar4) - 0x30;
    pbVar3 = (byte *)end;
    if (pbVar6 == (byte *)end) break;
    bVar7 = *pbVar6;
    pbVar3 = pbVar6;
  } while ((byte)(bVar7 - 0x30) < 10);
  *begin = (char8_t *)pbVar3;
  if ((9 < (long)pbVar3 - (long)pbVar1) &&
     (((long)pbVar3 - (long)pbVar1 != 10 ||
      (((ulong)(uVar4 - 0x30 & 0xfffffffe) + uVar5 * 10 & 0xffffffff80000000) != 0)))) {
    uVar2 = error_value;
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}